

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfacet.hpp
# Opt level: O2

vec3f __thiscall schuttejoe::GgxVndf(schuttejoe *this,vec3f wo,float roughness,float u1,float u2)

{
  float fVar1;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar2;
  double dVar3;
  float fVar4;
  vec3f vVar5;
  vec3f local_a8;
  float local_9c;
  vec3f local_98;
  float local_88;
  double local_78;
  double local_70;
  undefined1 local_68 [16];
  vec3f local_58;
  float local_48;
  undefined1 local_38 [16];
  float local_28;
  float fStack_24;
  float fStack_20;
  float fStack_1c;
  vec3f local_18;
  
  local_48 = wo.z;
  local_98.z = -local_48;
  if (-local_48 <= local_48) {
    local_98.z = local_48;
  }
  local_98.y = wo.y * roughness;
  local_98.x = wo.x * roughness;
  local_88 = u2;
  local_28 = roughness;
  fStack_24 = roughness;
  fStack_20 = roughness;
  fStack_1c = roughness;
  vVar5 = normalized(&local_98);
  local_a8.z = vVar5.z;
  local_a8._0_8_ = vVar5._0_8_;
  if (0.999 <= vVar5.y) {
    fVar4 = 1.0;
    fVar1 = 0.0;
    local_98.z = 0.0;
  }
  else {
    local_18.x = 0.0;
    local_18.y = 1.0;
    local_18.z = 0.0;
    vVar5 = cross(&local_a8,&local_18);
    local_58.z = vVar5.z;
    local_58._0_8_ = vVar5._0_8_;
    vVar5 = normalized(&local_58);
    local_98.z = vVar5.z;
    fVar4 = vVar5.x;
    fVar1 = vVar5.y;
  }
  local_98.y = fVar1;
  local_98.x = fVar4;
  vVar5 = cross(&local_98,&local_a8);
  local_9c = vVar5.z;
  local_38._8_4_ = extraout_XMM0_Dc;
  local_38._0_8_ = vVar5._0_8_;
  local_38._12_4_ = extraout_XMM0_Dd;
  fVar4 = 1.0 / (local_a8.z + 1.0);
  local_68 = ZEXT416((uint)fVar4);
  if (u1 < 0.0) {
    fVar1 = sqrtf(u1);
    fVar4 = (float)local_68._0_4_;
  }
  else {
    fVar1 = SQRT(u1);
  }
  if (fVar4 <= local_88) {
    fVar4 = ((local_88 - fVar4) / (1.0 - fVar4)) * PI + PI;
  }
  else {
    fVar4 = (local_88 / fVar4) * PI;
  }
  local_78 = (double)fVar4;
  local_70 = cos(local_78);
  dVar3 = sin(local_78);
  fVar2 = (float)(local_70 * (double)fVar1);
  fVar1 = (float)((double)(float)(~-(uint)(local_88 < (float)local_68._0_4_) & (uint)local_a8.z |
                                 -(uint)(local_88 < (float)local_68._0_4_) & 0x3f800000) *
                 dVar3 * (double)fVar1);
  fVar4 = (1.0 - fVar2 * fVar2) - fVar1 * fVar1;
  if (fVar4 <= 0.0) {
    fVar4 = 0.0;
  }
  fVar4 = SQRT(fVar4);
  dVar3 = (double)(local_a8.z * fVar4 + local_9c * fVar1 + local_98.z * fVar2);
  if (dVar3 <= 0.0) {
    dVar3 = 0.0;
  }
  if (local_48 < 0.0) {
    dVar3 = -dVar3;
  }
  local_58.z = (float)dVar3;
  local_58.y = (fVar4 * local_a8.y + (float)local_38._4_4_ * fVar1 + fVar2 * local_98.y) * fStack_24
  ;
  local_58.x = (fVar4 * local_a8.x + (float)local_38._0_4_ * fVar1 + fVar2 * local_98.x) * local_28;
  vVar5 = normalized(&local_58);
  return vVar5;
}

Assistant:

vec3f GgxVndf(vec3f wo, float roughness, float u1, float u2)
{
    float ttt = 1;
    if (wo.z < 0) {
        wo.z = -wo.z;
        ttt = -1;
    }
    // -- Stretch the view vector so we are sampling as though
    // -- roughness==1
    vec3f v = normalized(vec3f(wo.x * roughness,
                                wo.y * roughness,
                                wo.z ));

    // -- Build an orthonormal basis with v, t1, and t2
    vec3f t1 = (v.y < 0.999f) ? normalized(cross(v, vec3f(0,1,0))) : vec3f(1,0,0);
    vec3f t2 = cross(t1, v);

    // -- Choose a point on a disk with each half of the disk weighted
    // -- proportionally to its projection onto direction v
    float a = 1.0f / (1.0f + v.z);
    float r = sqrtf(u1);
    float phi = (u2 < a) ? (u2 / a) * PI 
                         : PI + (u2 - a) / (1.0f - a) * PI;
    float p1 = r * cos(phi);
    float p2 = r * sin(phi) * ((u2 < a) ? 1.0f : v.z);

    // -- Calculate the normal in this stretched tangent space
    vec3f n = p1 * t1 + p2 * t2
             + sqrtf(fmax(0.0f, 1.0f - p1 * p1 - p2 * p2)) * v;

    // -- unstretch and normalize the normal
    return normalized(vec3f(roughness * n.x,
                            roughness * n.y,
                            fmax(0.0f, n.z) * ttt));
}